

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_copy.cpp
# Opt level: O2

bool Image2Trinity(string *path,string *param_2)

{
  pointer puVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int exec_addr;
  int len;
  int iVar7;
  Data *pDVar8;
  exception *peVar9;
  int entry;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  byte local_d1;
  Sector *s;
  unique_ptr<Trinity,_std::default_delete<Trinity>_> trinity;
  MEMORY mem;
  shared_ptr<Disk> disk;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  devices;
  string name;
  pointer local_40;
  pointer local_38;
  
  std::make_shared<Disk>();
  s = (Sector *)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  uVar13 = 1;
  bVar3 = ReadImage(path,&disk,true);
  if (bVar3) {
    pbVar12 = (byte *)0x0;
    for (; (peVar2 = disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           pbVar12 == (byte *)0x0 && (uVar13 < 0xb)); uVar13 = uVar13 + 1) {
      Header::Header((Header *)&mem,0,0,uVar13,2);
      bVar4 = Disk::find(peVar2,(Header *)&mem,&s);
      if (!bVar4) goto LAB_00152fdc;
      lVar15 = 0;
      pbVar12 = (byte *)0x0;
      for (uVar11 = 0; (pbVar12 == (byte *)0x0 && (uVar11 < 2)); uVar11 = uVar11 + 1) {
        pDVar8 = Sector::data_copy(s,0);
        puVar1 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        mem._vptr_MEMORY = (_func_int **)&mem.pb;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&mem,puVar1 + lVar15 + 1,puVar1 + lVar15 + 0xb);
        pbVar12 = puVar1 + lVar15;
        std::__cxx11::string::operator=((string *)&name,(string *)&mem);
        std::__cxx11::string::~string((string *)&mem);
        if (((*pbVar12 & 0x3f) == 0x13) && (puVar1[lVar15 + 0xf2] != 0xff)) {
          std::__cxx11::string::substr((ulong)&mem,(ulong)&name);
          iVar6 = strcasecmp((char *)mem._vptr_MEMORY,"auto");
          std::__cxx11::string::~string((string *)&mem);
          if (iVar6 != 0) goto LAB_00152d5b;
        }
        else {
LAB_00152d5b:
          pbVar12 = (byte *)0x0;
        }
        lVar15 = lVar15 + 0x100;
      }
    }
    if (pbVar12 == (byte *)0x0) {
LAB_00152fdc:
      peVar9 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[38]>
                (peVar9,(char (*) [38])"no suitable auto-executing code found");
      __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar6 = TPeek(pbVar12 + 0xec,0x4000);
    exec_addr = TPeek(pbVar12 + 0xf2,0);
    len = TPeek(pbVar12 + 0xef,0);
    if (0x5fff < len + iVar6 && iVar6 < 0x8000) {
      peVar9 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[47]>
                (peVar9,(char (*) [47])"code overlaps 6000-7fff range used by TrinLoad");
      __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
    mem.size = len;
    mem.pb = AllocMem(len);
    bVar5 = pbVar12[0xd];
    pbVar12 = pbVar12 + 0xe;
    uVar13 = 9;
    iVar10 = 0;
    while( true ) {
      peVar2 = disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d1 = *pbVar12;
      iVar14 = len - iVar10;
      if (iVar14 == 0 || len < iVar10) break;
      Header::Header((Header *)&devices,(uint)(bVar5 & 0x7f),(uint)(bVar5 >> 7),(uint)local_d1,2);
      bVar4 = Disk::find(peVar2,(Header *)&devices,&s);
      if (!bVar4) {
LAB_00152f89:
        peVar9 = (exception *)__cxa_allocate_exception(0x10);
        CylHead::CylHead((CylHead *)&devices,(uint)(bVar5 & 0x7f),(uint)(bVar5 >> 7));
        util::exception::exception<char_const(&)[21],CylHead,char_const(&)[8],unsigned_char&>
                  (peVar9,(char (*) [21])"end of file reading ",(CylHead *)&devices,
                   (char (*) [8])0x1a9082,&local_d1);
        __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar7 = Sector::data_size(s);
      if (iVar7 != 0x200) goto LAB_00152f89;
      pDVar8 = Sector::data_copy(s,0);
      iVar7 = 0x1fe - uVar13;
      if (iVar14 <= (int)(0x1fe - uVar13)) {
        iVar7 = iVar14;
      }
      memcpy(mem.pb + iVar10,
             (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + uVar13,(long)iVar7);
      iVar10 = iVar7 + iVar10;
      puVar1 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = puVar1[0x1fe];
      pbVar12 = puVar1 + 0x1ff;
      uVar13 = 0;
    }
    Trinity::Open();
    Trinity::devices_abi_cxx11_
              (&devices,(Trinity *)
                        trinity._M_t.super___uniq_ptr_impl<Trinity,_std::default_delete<Trinity>_>.
                        _M_t.super__Tuple_impl<0UL,_Trinity_*,_std::default_delete<Trinity>_>.
                        super__Head_base<0UL,_Trinity_*,_false>._M_head_impl);
    local_38 = name._M_dataplus._M_p;
    local_40 = ((devices.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    Message<char_const*,char_const*>(msgStatus,"Sending %s to %s...",&local_38,&local_40);
    Trinity::send_file((Trinity *)
                       trinity._M_t.super___uniq_ptr_impl<Trinity,_std::default_delete<Trinity>_>.
                       _M_t.super__Tuple_impl<0UL,_Trinity_*,_std::default_delete<Trinity>_>.
                       super__Head_base<0UL,_Trinity_*,_false>._M_head_impl,mem.pb,mem.size,iVar6,
                       exec_addr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&devices);
    std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::~unique_ptr(&trinity);
    MEMORY::~MEMORY(&mem);
  }
  std::__cxx11::string::~string((string *)&name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar3;
}

Assistant:

bool Image2Trinity(const std::string& path, const std::string&/*trinity_path*/) // ToDo: use trinity_path for record
{
    auto disk = std::make_shared<Disk>();
    const Sector* s = nullptr;
    const MGT_DIR* pdir = nullptr;
    std::string name;

    if (!ReadImage(path, disk))
        return false;

    // Scanning the first 10 directory sectors should be enough
    for (auto sector = 1; !pdir && sector <= MGT_SECTORS; ++sector)
    {
        if (!disk->find(Header(0, 0, sector, 2), s))
            break;

        // Each sector contains 2 MGT directory entries
        for (auto entry = 0; !pdir && entry < 2; ++entry)
        {
            pdir = reinterpret_cast<const MGT_DIR*>(s->data_copy().data() + 256 * entry);

            // Extract the first 4 characters of a potential MGT filename
            name = std::string(reinterpret_cast<const char*>(pdir->abName), 10);

            // Reject if not a code file, or no auto-execute, or not named AUTO*
            if ((pdir->bType & 0x3f) != 19 || pdir->bExecutePage == 0xff ||
                strcasecmp(name.substr(0, 4).c_str(), "auto"))
                pdir = nullptr;
        }
    }

    if (!pdir)
        throw util::exception("no suitable auto-executing code found");

    auto start_addr = TPeek(&pdir->bStartPage, 16384);
    auto exec_addr = TPeek(&pdir->bExecutePage);
    auto file_length = TPeek(&pdir->bLengthInPages);

    // Check the code wouldn't overwrite TrinLoad
    if (start_addr < 0x8000 && (start_addr + file_length) >= 0x6000)
        throw util::exception("code overlaps 6000-7fff range used by TrinLoad");

    auto uPos = 0;
    MEMORY mem(file_length);

    // The file start sector is taken from the directory entry.
    // Code files have a 9-byte metadata header, which must be skipped.
    auto trk = pdir->bStartTrack;
    auto sec = pdir->bStartSector;
    auto uOffset = MGT_FILE_HEADER_SIZE;

    // Loop until we've read the full file
    while (uPos < file_length)
    {
        // Bit 7 of the track number indicates head 1
        uint8_t cyl = (trk & 0x7f);
        uint8_t head = trk >> 7;

        if (!disk->find(Header(cyl, head, sec, 2), s) || s->data_size() != SECTOR_SIZE)
            throw util::exception("end of file reading ", CylHead(cyl, head), " sector", sec);

        // Determine the size of data in this sector, which is at most 510 bytes.
        // The final 2 bytes contain the location of the next sector.
        auto uBlock = std::min(file_length - uPos, 510 - uOffset);
        auto& data = s->data_copy();

        memcpy(mem + uPos, data.data() + uOffset, uBlock);
        uPos += uBlock;
        uOffset = 0;

        // Follow the chain to the next sector
        trk = data[510];
        sec = data[511];
    }

    // Scan the local network for SAM machines running TrinLoad
    auto trinity = Trinity::Open();
    auto devices = trinity->devices();

    // Send the code file to the first device that responded
    Message(msgStatus, "Sending %s to %s...", name.c_str(), devices[0].c_str());
    trinity->send_file(mem, mem.size, start_addr, exec_addr);

    return true;
}